

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O3

void eve::randomiseevents
               (OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
               bool textmode)

{
  uint uVar1;
  uint *puVar2;
  result_type rVar3;
  int iVar4;
  int iVar5;
  iterator it;
  uint *__ptr;
  uniform_int_distribution<int> d;
  default_random_engine e;
  uniform_int_distribution<int> local_40;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  local_38._M_x = 0x4d2;
  __ptr = (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  puVar2 = (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (__ptr != puVar2) {
    iVar5 = (int)((ulong)((long)puVar2 - (long)__ptr) >> 2);
    iVar4 = -pno_;
    do {
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + -1;
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = iVar5;
      rVar3 = std::uniform_int_distribution<int>::operator()(&local_40,&local_38,&local_40._M_param)
      ;
      uVar1 = *__ptr;
      *__ptr = __ptr[rVar3];
      __ptr[rVar3] = uVar1;
      if (iVar4 % total_ == 0) {
        if (textmode) {
          fprintf(_stdout,"%d\n",(ulong)*__ptr);
        }
        else {
          fwrite(__ptr,4,1,_stdout);
        }
      }
      __ptr = __ptr + 1;
    } while (__ptr != (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void randomiseevents(OASIS_INT pno_, OASIS_INT total_,
			 std::vector<int> &events, bool textmode) {

	unsigned seed = 1234;
	std::default_random_engine e(seed);

	// As we only consider swapping each element once as we go through the
	// vector sequentially, we can output events IDs as we proceed. We are
	// only interested in a particular process ID, so only output events IDs
	// assigned to that process
	auto eventsSize = events.size();
	int counter = 1;
	for (std::vector<int>::iterator it = events.begin(); it != events.end();
	     it++) {

	    // Implement Fisher-Yates shuffle
	    std::uniform_int_distribution<> d(0, --eventsSize);
	    std::iter_swap(it, it + d(e));

	    if ((counter - pno_) % total_ == 0) {

		if (textmode) fprintf(stdout, "%d\n", *it);
		else fwrite(&(*it), sizeof(*it), 1, stdout);

	    }
	    counter++;

	}

    }